

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkOptionsCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_15dd3da::TargetLinkOptionsImpl::HandleDirectContent
          (TargetLinkOptionsImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmListFileBacktrace lfbt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50;
  
  cmMakefile::GetBacktrace((this->super_cmTargetPropCommandBase).Makefile);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])(&local_80,this,content);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  paVar1 = &local_50.Value.field_2;
  if (local_80 == &local_70) {
    local_50.Value.field_2._8_8_ = local_70._8_8_;
    local_50.Value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.Value._M_dataplus._M_p = (pointer)local_80;
  }
  local_50.Value.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_50.Value.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_50.Value._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_60;
  local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_58;
  local_80 = &local_70;
  cmTarget::InsertLinkOption(tgt,&local_50,prepend);
  if (local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.Value._M_dataplus._M_p,local_50.Value.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0])
                             + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool prepend, bool /*system*/) override
  {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    tgt->InsertLinkOption(BT<std::string>(this->Join(content), lfbt), prepend);
    return true; // Successfully handled.
  }